

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int glslang::TIntermediate::computeTypeUniformLocationSize(TType *type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TType elementType;
  TType TStack_b8;
  
  iVar1 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*type->_vptr_TType[0x25])(type);
    iVar2 = 1;
    if ((char)iVar1 != '\0') {
      iVar1 = (*type->_vptr_TType[0x25])(type);
      if ((char)iVar1 != '\0') {
        iVar2 = 0;
        iVar1 = 0;
        do {
          if ((int)((ulong)((long)(((type->field_13).referentType)->qualifier).semanticName -
                           *(long *)&((type->field_13).referentType)->field_0x8) >> 5) <= iVar2) {
            return iVar1;
          }
          TType::TType(&TStack_b8,type,iVar2,false);
          iVar3 = computeTypeUniformLocationSize(&TStack_b8);
          iVar1 = iVar1 + iVar3;
          iVar2 = iVar2 + 1;
          iVar3 = (*type->_vptr_TType[0x25])(type);
        } while ((char)iVar3 != '\0');
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
  }
  else {
    TType::TType(&TStack_b8,type,0,false);
    iVar1 = (*type->_vptr_TType[0x1e])(type);
    if ((char)iVar1 == '\0') {
      iVar2 = computeTypeUniformLocationSize(&TStack_b8);
    }
    else {
      iVar1 = (*type->_vptr_TType[0xf])(type);
      iVar2 = computeTypeUniformLocationSize(&TStack_b8);
      iVar2 = iVar2 * iVar1;
    }
  }
  return iVar2;
}

Assistant:

int TIntermediate::computeTypeUniformLocationSize(const TType& type)
{
    // "Individual elements of a uniform array are assigned
    // consecutive locations with the first element taking location
    // location."
    if (type.isArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        TType elementType(type, 0);
        if (type.isSizedArray()) {
            return type.getOuterArraySize() * computeTypeUniformLocationSize(elementType);
        } else {
            // TODO: are there valid cases of having an implicitly-sized array with a location?  If so, running this code too early.
            return computeTypeUniformLocationSize(elementType);
        }
    }

    // "Each subsequent inner-most member or element gets incremental
    // locations for the entire structure or array."
    if (type.isStruct()) {
        int size = 0;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            size += computeTypeUniformLocationSize(memberType);
        }
        return size;
    }

    return 1;
}